

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

float ncnn::reduction(float v0,float *ptr,int size,int stride,int op_type)

{
  float fVar1;
  float sum;
  
  switch(op_type) {
  case 0:
    if (0 < size) {
      do {
        v0 = v0 + *ptr;
        ptr = ptr + stride;
        size = size + -1;
      } while (size != 0);
    }
    break;
  case 1:
    if (0 < size) {
      do {
        v0 = v0 + ABS(*ptr);
        ptr = ptr + stride;
        size = size + -1;
      } while (size != 0);
    }
    break;
  case 2:
    if (0 < size) {
      do {
        v0 = v0 + *ptr * *ptr;
        ptr = ptr + stride;
        size = size + -1;
      } while (size != 0);
    }
    break;
  case 3:
  case 7:
  case 8:
  case 9:
    break;
  case 4:
    if (0 < size) {
      do {
        if (v0 <= *ptr) {
          v0 = *ptr;
        }
        ptr = ptr + stride;
        size = size + -1;
      } while (size != 0);
    }
    break;
  case 5:
    if (0 < size) {
      do {
        if (*ptr <= v0) {
          v0 = *ptr;
        }
        ptr = ptr + stride;
        size = size + -1;
      } while (size != 0);
    }
    break;
  case 6:
    if (0 < size) {
      do {
        v0 = v0 * *ptr;
        ptr = ptr + stride;
        size = size + -1;
      } while (size != 0);
    }
    break;
  case 10:
    if (0 < size) {
      do {
        fVar1 = expf(*ptr);
        v0 = v0 + fVar1;
        ptr = ptr + stride;
        size = size + -1;
      } while (size != 0);
    }
    break;
  default:
    goto switchD_0034225d_default;
  }
switchD_0034225d_default:
  return v0;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int stride, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size, stride);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size, stride);

    // should never reach here
    return v0;
}